

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O2

google_protobuf_OneofDescriptorProto * oneofdef_toproto(upb_ToProto_Context *ctx,upb_OneofDef *o)

{
  upb_Arena *a;
  _Bool _Var1;
  upb_DecodeStatus uVar2;
  google_protobuf_OneofDescriptorProto *msg;
  char *pcVar3;
  google_protobuf_OneofOptions *msg_00;
  upb_Message *msg_01;
  size_t size;
  char *ptr;
  size_t local_38;
  
  msg = (google_protobuf_OneofDescriptorProto *)
        _upb_Message_New(&google__protobuf__OneofDescriptorProto_msg_init,ctx->arena);
  if (msg != (google_protobuf_OneofDescriptorProto *)0x0) {
    pcVar3 = upb_OneofDef_Name(o);
    _ptr = strviewdup(ctx,pcVar3);
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130cf0,&ptr);
    _Var1 = upb_OneofDef_HasOptions(o);
    if (!_Var1) {
      return msg;
    }
    msg_00 = upb_OneofDef_Options(o);
    upb_Encode(&msg_00->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__OneofOptions_msg_init,0,ctx->arena,&ptr,&size);
    pcVar3 = ptr;
    if (ptr != (char *)0x0) {
      a = ctx->arena;
      msg_01 = _upb_Message_New(&google__protobuf__OneofOptions_msg_init,a);
      if ((msg_01 != (upb_Message *)0x0) &&
         (uVar2 = upb_Decode(pcVar3,size,msg_01,&google__protobuf__OneofOptions_msg_init,
                             (upb_ExtensionRegistry *)0x0,0,a), uVar2 == kUpb_DecodeStatus_Ok)) {
        ptr = (char *)msg_01;
        upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130c30,&ptr);
        return msg;
      }
    }
  }
  longjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static google_protobuf_OneofDescriptorProto* oneofdef_toproto(upb_ToProto_Context* ctx,
                                                     const upb_OneofDef* o) {
  google_protobuf_OneofDescriptorProto* proto =
      google_protobuf_OneofDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_OneofDescriptorProto_set_name(proto,
                                       strviewdup(ctx, upb_OneofDef_Name(o)));

  if (upb_OneofDef_HasOptions(o)) {
    SET_OPTIONS(proto, OneofDescriptorProto, OneofOptions,
                upb_OneofDef_Options(o));
  }

  return proto;
}